

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileLED.cpp
# Opt level: O0

void __thiscall TileLED::updateLED(TileLED *this,State state)

{
  uint uVar1;
  bool bVar2;
  reference ppTVar3;
  Vector2u *pVVar4;
  Board *pBVar5;
  TileLED *in_RDI;
  TileLED *currentLED;
  Board *in_stack_ffffffffffffffa8;
  Direction in_stack_ffffffffffffffb4;
  Board *in_stack_ffffffffffffffb8;
  Vector2<unsigned_int> local_38;
  Vector2<unsigned_int> local_30;
  Vector2<unsigned_int> local_28;
  Vector2<unsigned_int> local_20;
  value_type local_18;
  
  _addNextTile(in_RDI,(Tile *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
               (State *)in_stack_ffffffffffffffa8);
  while (bVar2 = std::stack<TileLED_*,_std::deque<TileLED_*,_std::allocator<TileLED_*>_>_>::empty
                           ((stack<TileLED_*,_std::deque<TileLED_*,_std::allocator<TileLED_*>_>_> *)
                            0x19bd8b), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppTVar3 = std::stack<TileLED_*,_std::deque<TileLED_*,_std::allocator<TileLED_*>_>_>::top
                        ((stack<TileLED_*,_std::deque<TileLED_*,_std::allocator<TileLED_*>_>_> *)
                         0x19bda2);
    local_18 = *ppTVar3;
    std::stack<TileLED_*,_std::deque<TileLED_*,_std::allocator<TileLED_*>_>_>::pop
              ((stack<TileLED_*,_std::deque<TileLED_*,_std::allocator<TileLED_*>_>_> *)0x19bdb6);
    pVVar4 = Tile::getPosition(&local_18->super_Tile);
    if (pVVar4->y != 0) {
      in_stack_ffffffffffffffb8 = Tile::getBoardPtr(&in_RDI->super_Tile);
      pVVar4 = Tile::getPosition(&local_18->super_Tile);
      in_stack_ffffffffffffffb4 = pVVar4->x;
      pVVar4 = Tile::getPosition(&local_18->super_Tile);
      sf::Vector2<unsigned_int>::Vector2(&local_20,in_stack_ffffffffffffffb4,pVVar4->y - 1);
      Board::getTile(in_stack_ffffffffffffffb8,&local_20);
      _addNextTile(in_RDI,(Tile *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                   (State *)in_stack_ffffffffffffffa8);
    }
    pVVar4 = Tile::getPosition(&local_18->super_Tile);
    uVar1 = pVVar4->x;
    pBVar5 = Tile::getBoardPtr(&in_RDI->super_Tile);
    pVVar4 = Board::getSize(pBVar5);
    if (uVar1 < pVVar4->x - 1) {
      in_stack_ffffffffffffffa8 = Tile::getBoardPtr(&in_RDI->super_Tile);
      pVVar4 = Tile::getPosition(&local_18->super_Tile);
      uVar1 = pVVar4->x;
      pVVar4 = Tile::getPosition(&local_18->super_Tile);
      sf::Vector2<unsigned_int>::Vector2(&local_28,uVar1 + 1,pVVar4->y);
      Board::getTile(in_stack_ffffffffffffffa8,&local_28);
      _addNextTile(in_RDI,(Tile *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                   (State *)in_stack_ffffffffffffffa8);
    }
    pVVar4 = Tile::getPosition(&local_18->super_Tile);
    uVar1 = pVVar4->y;
    pBVar5 = Tile::getBoardPtr(&in_RDI->super_Tile);
    pVVar4 = Board::getSize(pBVar5);
    if (uVar1 < pVVar4->y - 1) {
      pBVar5 = Tile::getBoardPtr(&in_RDI->super_Tile);
      pVVar4 = Tile::getPosition(&local_18->super_Tile);
      uVar1 = pVVar4->x;
      pVVar4 = Tile::getPosition(&local_18->super_Tile);
      sf::Vector2<unsigned_int>::Vector2(&local_30,uVar1,pVVar4->y + 1);
      Board::getTile(pBVar5,&local_30);
      _addNextTile(in_RDI,(Tile *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                   (State *)in_stack_ffffffffffffffa8);
    }
    pVVar4 = Tile::getPosition(&local_18->super_Tile);
    if (pVVar4->x != 0) {
      pBVar5 = Tile::getBoardPtr(&in_RDI->super_Tile);
      pVVar4 = Tile::getPosition(&local_18->super_Tile);
      uVar1 = pVVar4->x;
      pVVar4 = Tile::getPosition(&local_18->super_Tile);
      sf::Vector2<unsigned_int>::Vector2(&local_38,uVar1 - 1,pVVar4->y);
      Board::getTile(pBVar5,&local_38);
      _addNextTile(in_RDI,(Tile *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                   (State *)in_stack_ffffffffffffffa8);
    }
  }
  std::vector<TileLED_*,_std::allocator<TileLED_*>_>::clear
            ((vector<TileLED_*,_std::allocator<TileLED_*>_> *)0x19bfd5);
  return;
}

Assistant:

void TileLED::updateLED(State state) {
    assert(traversedLEDs.empty());
    assert(LEDNodes.empty());
    
    //cout << "Update LED started at (" << getPosition().x << ", " << getPosition().y << ")." << endl;
    
    _addNextTile(this, NORTH, state);
    while (!LEDNodes.empty()) {    // Start a depth-first traversal on the connected LEDs.
        TileLED* currentLED = LEDNodes.top();
        LEDNodes.pop();
        
        //cout << "  currently at (" << currentLED->getPosition().x << ", " << currentLED->getPosition().y << ")" << endl;
        
        if (currentLED->getPosition().y > 0) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentLED->getPosition().x, currentLED->getPosition().y - 1)), NORTH, state);
        }
        if (currentLED->getPosition().x < getBoardPtr()->getSize().x - 1) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentLED->getPosition().x + 1, currentLED->getPosition().y)), EAST, state);
        }
        if (currentLED->getPosition().y < getBoardPtr()->getSize().y - 1) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentLED->getPosition().x, currentLED->getPosition().y + 1)), SOUTH, state);
        }
        if (currentLED->getPosition().x > 0) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentLED->getPosition().x - 1, currentLED->getPosition().y)), WEST, state);
        }
    }
    traversedLEDs.clear();
}